

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  uint16_t lb_start_00;
  uint16_t lb_end_00;
  uint local_2c;
  ushort local_26;
  uint32_t hb;
  uint16_t lb_end;
  uint16_t hb_end;
  uint16_t lb_start;
  uint16_t hb_start;
  uint64_t range_end_local;
  uint64_t range_start_local;
  roaring_bitmap_t *x1_local;
  
  if (range_start < range_end) {
    _lb_end = range_end;
    if (0xffffffff < range_end) {
      _lb_end = 0;
    }
    hb._2_2_ = (uint16_t)(range_start >> 0x10);
    lb_start_00 = (uint16_t)range_start;
    local_26 = (ushort)(_lb_end - 1 >> 0x10);
    lb_end_00 = (short)_lb_end - 1;
    if (hb._2_2_ == local_26) {
      inplace_flip_container(&x1->high_low_container,hb._2_2_,lb_start_00,lb_end_00);
    }
    else {
      if (lb_start_00 != 0) {
        inplace_flip_container(&x1->high_low_container,hb._2_2_,lb_start_00,0xffff);
        hb._2_2_ = hb._2_2_ + 1;
      }
      if (lb_end_00 != 0xffff) {
        local_26 = local_26 - 1;
      }
      for (local_2c = (uint)hb._2_2_; local_2c <= local_26; local_2c = local_2c + 1) {
        inplace_fully_flip_container(&x1->high_low_container,(uint16_t)local_2c);
      }
      if (lb_end_00 != 0xffff) {
        inplace_flip_container(&x1->high_low_container,local_26 + 1,0,lb_end_00);
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1, uint64_t range_start,
                                 uint64_t range_end) {
    if (range_start >= range_end) {
        return;  // empty range
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}